

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::BinaryAssertionExpr::requireSequence
          (BinaryAssertionExpr *this,ASTContext *context,DiagCode code)

{
  BinaryAssertionOperator BVar1;
  logic_error *this_00;
  string local_118;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  SourceRange local_40;
  DiagCode local_2c;
  DiagCode local_28;
  DiagCode local_24;
  ASTContext *local_20;
  ASTContext *context_local;
  BinaryAssertionExpr *this_local;
  DiagCode code_local;
  
  BVar1 = this->op;
  local_20 = context;
  context_local = (ASTContext *)this;
  this_local._4_4_ = code;
  if (BVar1 < Intersect) {
    local_24 = code;
    AssertionExpr::requireSequence(this->left,context,code);
    local_28 = this_local._4_4_;
    AssertionExpr::requireSequence(this->right,local_20,this_local._4_4_);
  }
  else if (2 < BVar1 - Intersect) {
    if (9 < BVar1 - Iff) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                 ,&local_e1);
      std::operator+(&local_c0,&local_e0,":");
      std::__cxx11::to_string(&local_118,0x3af);
      std::operator+(&local_a0,&local_c0,&local_118);
      std::operator+(&local_80,&local_a0,": ");
      std::operator+(&local_60,&local_80,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_60);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if ((this->super_AssertionExpr).syntax == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                 ,0x3ab,
                 "void slang::ast::BinaryAssertionExpr::requireSequence(const ASTContext &, DiagCode) const"
                );
    }
    local_2c = code;
    local_40 = slang::syntax::SyntaxNode::sourceRange((this->super_AssertionExpr).syntax);
    ASTContext::addDiag(context,local_2c,local_40);
  }
  return;
}

Assistant:

void BinaryAssertionExpr::requireSequence(const ASTContext& context, DiagCode code) const {
    switch (op) {
        case BinaryAssertionOperator::And:
        case BinaryAssertionOperator::Or:
            left.requireSequence(context, code);
            right.requireSequence(context, code);
            return;
        case BinaryAssertionOperator::Intersect:
        case BinaryAssertionOperator::Throughout:
        case BinaryAssertionOperator::Within:
            return;
        case BinaryAssertionOperator::Iff:
        case BinaryAssertionOperator::Until:
        case BinaryAssertionOperator::SUntil:
        case BinaryAssertionOperator::UntilWith:
        case BinaryAssertionOperator::SUntilWith:
        case BinaryAssertionOperator::Implies:
        case BinaryAssertionOperator::OverlappedImplication:
        case BinaryAssertionOperator::NonOverlappedImplication:
        case BinaryAssertionOperator::OverlappedFollowedBy:
        case BinaryAssertionOperator::NonOverlappedFollowedBy:
            ASSERT(syntax);
            context.addDiag(code, syntax->sourceRange());
            return;
    }
    ASSUME_UNREACHABLE;
}